

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YPSpur_md_freeze(YPSpur *spur)

{
  int iVar1;
  undefined1 local_50 [8];
  YPSpur_msg msg;
  YPSpur *spur_local;
  
  local_50 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x200;
  msg.data[3] = (double)spur;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_50);
  if (iVar1 < 0) {
    *(undefined4 *)((long)msg.data[3] + 0x234) = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YPSpur_md_freeze(YPSpur* spur)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_FREEZE;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}